

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# daily_file_sink.h
# Opt level: O1

filename_t *
spdlog::sinks::daily_filename_calculator::calc_filename
          (filename_t *__return_storage_ptr__,filename_t *filename,tm *now_tm)

{
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v8::basic_format_context<fmt::v8::appender,_char>_>_2
  in_R9;
  string_view fmt;
  format_args args;
  filename_t ext;
  filename_t basename;
  undefined1 *local_b8;
  undefined8 uStack_b0;
  undefined1 local_a8;
  undefined7 uStack_a7;
  char *local_98;
  size_type sStack_90;
  char local_88;
  undefined7 uStack_87;
  undefined1 local_78 [32];
  _Alloc_hider local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  undefined1 *local_38;
  undefined8 uStack_30;
  
  sStack_90 = 0;
  local_88 = '\0';
  uStack_b0 = 0;
  local_a8 = 0;
  local_b8 = &local_a8;
  local_98 = &local_88;
  details::file_helper::split_by_extension
            ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_78,filename);
  std::__cxx11::string::operator=((string *)&local_98,(string *)&local_58);
  std::__cxx11::string::operator=((string *)&local_b8,(string *)local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_p != &local_48) {
    operator_delete(local_58._M_p,local_48._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
    operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
  }
  local_78._16_8_ = ZEXT48(now_tm->tm_year + 0x76c);
  local_58._M_p = (pointer)(ulong)(now_tm->tm_mon + 1);
  local_48._M_allocated_capacity = (size_type)(uint)now_tm->tm_mday;
  local_78._0_8_ = local_98;
  local_78._8_8_ = sStack_90;
  local_38 = local_b8;
  uStack_30 = uStack_b0;
  fmt.size_ = 0xd111d;
  fmt.data_ = (char *)0x19;
  args.field_1.args_ = in_R9.args_;
  args.desc_ = (unsigned_long_long)local_78;
  ::fmt::v8::vformat_abi_cxx11_(__return_storage_ptr__,(v8 *)"{}_{:04d}-{:02d}-{:02d}{}",fmt,args);
  if (local_b8 != &local_a8) {
    operator_delete(local_b8,CONCAT71(uStack_a7,local_a8) + 1);
  }
  if (local_98 != &local_88) {
    operator_delete(local_98,CONCAT71(uStack_87,local_88) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

static filename_t calc_filename(const filename_t &filename, const tm &now_tm)
    {
        filename_t basename, ext;
        std::tie(basename, ext) = details::file_helper::split_by_extension(filename);
        return fmt_lib::format(SPDLOG_FMT_STRING(SPDLOG_FILENAME_T("{}_{:04d}-{:02d}-{:02d}{}")), basename, now_tm.tm_year + 1900,
            now_tm.tm_mon + 1, now_tm.tm_mday, ext);
    }